

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  MPP_RET MVar1;
  MpiEncTestArgs *cmd;
  
  cmd = mpi_enc_test_cmd_get();
  MVar1 = mpi_enc_test_cmd_update_by_args(cmd,argc,argv);
  if (MVar1 == MPP_OK) {
    mpi_enc_test_cmd_show_opt(cmd);
    MVar1 = enc_test_multi(cmd,*argv);
  }
  mpi_enc_test_cmd_put(cmd);
  return MVar1;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = MPP_NOK;
    MpiEncTestArgs* cmd = mpi_enc_test_cmd_get();

    // parse the cmd option
    ret = mpi_enc_test_cmd_update_by_args(cmd, argc, argv);
    if (ret)
        goto DONE;

    mpi_enc_test_cmd_show_opt(cmd);

    ret = enc_test_multi(cmd, argv[0]);

DONE:
    mpi_enc_test_cmd_put(cmd);

    return ret;
}